

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MutexFactory.cpp
# Opt level: O0

void __thiscall Mutex::~Mutex(Mutex *this)

{
  Mutex *in_RDI;
  
  ~Mutex(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

Mutex::~Mutex()
{
	if (isValid)
	{
		MutexFactory::i()->DestroyMutex(handle);
	}
}